

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O3

_Bool longoptarg(char *arg,char *expected,char **val,int *argcp,char ***argvp)

{
  char cVar1;
  char **ppcVar2;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  char cVar6;
  char *pcVar7;
  bool bVar8;
  
  sVar5 = strlen(expected);
  sVar5 = (size_t)(int)sVar5;
  iVar4 = bcmp(arg,expected,sVar5);
  if (iVar4 == 0) {
    if (arg[sVar5] == '\0') {
      iVar4 = *argcp;
      *argcp = iVar4 + -1;
      if (iVar4 < 2) {
        longoptarg_cold_1();
        iVar4 = strcmp(expected,"none");
        if (iVar4 == 0) {
          cVar6 = '\x01';
        }
        else {
          iVar4 = strcmp(expected,"tis");
          if (iVar4 == 0) {
            cVar6 = '\x10';
          }
          else {
            iVar4 = strcmp(expected,"cryptocard");
            cVar6 = ' ';
            if ((iVar4 != 0) && (iVar4 = strcmp(expected,"ccard"), iVar4 != 0)) {
              iVar4 = strcmp(expected,"keyboard-interactive");
              cVar6 = '\b';
              if (((iVar4 != 0) &&
                  ((iVar4 = strcmp(expected,"k-i"), iVar4 != 0 &&
                   (iVar4 = strcmp(expected,"kbdint"), iVar4 != 0)))) &&
                 ((cVar1 = *expected, cVar1 != 'k' ||
                  ((expected[1] != 'i' || (expected[2] != '\0')))))) {
                iVar4 = strcmp(expected,"publickey");
                cVar6 = '\x04';
                if ((iVar4 != 0) && (iVar4 = strcmp(expected,"pubkey"), iVar4 != 0)) {
                  if (cVar1 == 'p') {
                    if ((expected[1] == 'k') && (expected[2] == '\0')) {
                      return true;
                    }
                    iVar4 = strcmp(expected,"password");
                    if (iVar4 == 0) {
                      return true;
                    }
                    if (expected[1] != 'w') {
                      return false;
                    }
                    bVar8 = expected[2] == '\0';
                  }
                  else {
                    iVar4 = strcmp(expected,"password");
                    bVar8 = iVar4 == 0;
                  }
                  cVar6 = bVar8 * '\x02';
                }
              }
            }
          }
        }
        return (_Bool)cVar6;
      }
      ppcVar2 = *argvp;
      *argvp = ppcVar2 + 1;
      pcVar7 = ppcVar2[1];
    }
    else {
      if (arg[sVar5] != '=') goto LAB_001109e6;
      pcVar7 = arg + sVar5 + 1;
    }
    *val = pcVar7;
    _Var3 = true;
  }
  else {
LAB_001109e6:
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

static bool longoptarg(const char *arg, const char *expected,
                       const char **val, int *argcp, char ***argvp)
{
    int len = strlen(expected);
    if (memcmp(arg, expected, len))
        return false;
    if (arg[len] == '=') {
        *val = arg + len + 1;
        return true;
    } else if (arg[len] == '\0') {
        if (--*argcp > 0) {
            *val = *++*argvp;
            return true;
        } else {
            fprintf(stderr, "%s: option %s expects an argument\n",
                    appname, expected);
            exit(1);
        }
    }
    return false;
}